

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::changeEvent(QMenu *this,QEvent *e)

{
  ushort uVar1;
  long lVar2;
  void *pvVar3;
  long *plVar4;
  int iVar5;
  QStyle *pQVar6;
  undefined8 *puVar7;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(e + 8);
  if (uVar1 < 0x62) {
    if ((uVar1 != 0x5a) && (uVar1 != 0x61)) goto LAB_0045d17c;
  }
  else {
    if (uVar1 == 0x62) {
      if (((*(long *)(lVar2 + 0x318) != 0) && (*(int *)(*(long *)(lVar2 + 0x318) + 4) != 0)) &&
         (*(QWidget **)(lVar2 + 800) != (QWidget *)0x0)) {
        QWidget::setEnabled(*(QWidget **)(lVar2 + 800),
                            (((this->super_QWidget).data)->widget_attributes & 1) == 0);
      }
      QAction::setEnabled(SUB81(*(undefined8 *)(lVar2 + 0x3a8),0));
      if (((*(long *)(lVar2 + 0x3b8) != 0) && (*(int *)(*(long *)(lVar2 + 0x3b8) + 4) != 0)) &&
         (plVar4 = *(long **)(lVar2 + 0x3c0), plVar4 != (long *)0x0)) {
        (**(code **)(*plVar4 + 0xa0))
                  (plVar4,(((this->super_QWidget).data)->widget_attributes & 1) == 0);
      }
      goto LAB_0045d17c;
    }
    if (uVar1 != 100) goto LAB_0045d17c;
  }
  *(byte *)(lVar2 + 0x420) = *(byte *)(lVar2 + 0x420) | 1;
  pQVar6 = QWidget::style(&this->super_QWidget);
  iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x14,0,this,0);
  QWidget::setAttribute(&this->super_QWidget,WA_MouseTracking,iVar5 != 0);
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
    local_30 = (QSize)(**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
    QWidget::resize(&this->super_QWidget,&local_30);
  }
  pQVar6 = QWidget::style(&this->super_QWidget);
  iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x1e,0,this,0);
  pvVar3 = *(void **)(lVar2 + 0x2a8);
  if (iVar5 == 0) {
    if ((pvVar3 != (void *)0x0) && (*(int *)((long)pvVar3 + 4) != 0)) {
      QBasicTimer::stop();
    }
    operator_delete(pvVar3,0xc);
    *(undefined8 *)(lVar2 + 0x2a8) = 0;
  }
  else if (pvVar3 == (void *)0x0) {
    puVar7 = (undefined8 *)operator_new(0xc);
    *puVar7 = 0;
    *(undefined2 *)(puVar7 + 1) = 0;
    *(undefined8 **)(lVar2 + 0x2a8) = puVar7;
  }
LAB_0045d17c:
  QWidget::changeEvent(&this->super_QWidget,e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::changeEvent(QEvent *e)
{
    Q_D(QMenu);
    if (e->type() == QEvent::StyleChange || e->type() == QEvent::FontChange ||
        e->type() == QEvent::LayoutDirectionChange) {
        d->itemsDirty = 1;
        setMouseTracking(style()->styleHint(QStyle::SH_Menu_MouseTracking, nullptr, this));
        if (isVisible())
            resize(sizeHint());
        if (!style()->styleHint(QStyle::SH_Menu_Scrollable, nullptr, this)) {
            delete d->scroll;
            d->scroll = nullptr;
        } else if (!d->scroll) {
            d->scroll = new QMenuPrivate::QMenuScroller;
            d->scroll->scrollFlags = QMenuPrivate::QMenuScroller::ScrollNone;
        }
    } else if (e->type() == QEvent::EnabledChange) {
        if (d->tornPopup) // torn-off menu
            d->tornPopup->setEnabled(isEnabled());
        d->menuAction->setEnabled(isEnabled());
        if (!d->platformMenu.isNull())
            d->platformMenu->setEnabled(isEnabled());
    }
    QWidget::changeEvent(e);
}